

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O3

bool flatbuffers::StringToNumber<int>(char *s,int *val)

{
  byte *pbVar1;
  longlong lVar2;
  byte bVar3;
  bool bVar4;
  int __base;
  longlong lVar5;
  char *endptr;
  char *local_20;
  
  if ((s == (char *)0x0) || (val == (int *)0x0)) {
    __assert_fail("s && val",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/util.h"
                  ,0x14b,"bool flatbuffers::StringToNumber(const char *, T *) [T = int]");
  }
  bVar3 = *s;
  if (bVar3 != 0) {
    pbVar1 = (byte *)(s + 1);
    do {
      if ((int)(char)bVar3 - 0x30U < 10) {
        if ((bVar3 == 0x30) && ((*pbVar1 & 0xdf) == 0x58)) {
          __base = 0x10;
          goto LAB_0013b4af;
        }
        break;
      }
      bVar3 = *pbVar1;
      pbVar1 = pbVar1 + 1;
    } while (bVar3 != 0);
  }
  __base = 10;
LAB_0013b4af:
  local_20 = s;
  lVar2 = strtoll_l(s,&local_20,__base,ClassicLocale::instance_);
  lVar5 = 0;
  if (local_20 != s) {
    bVar4 = false;
    if (*local_20 != '\0') goto LAB_0013b4f0;
    if (lVar2 < 0x80000000) {
      bVar4 = -0x80000001 < lVar2;
      lVar5 = -0x80000000;
      if (-0x80000000 < lVar2) {
        lVar5 = lVar2;
      }
      goto LAB_0013b4f0;
    }
    lVar5 = 0x7fffffff;
  }
  bVar4 = false;
LAB_0013b4f0:
  *val = (int)lVar5;
  return bVar4;
}

Assistant:

inline bool StringToNumber(const char *s, T *val) {
  // Assert on `unsigned long` and `signed long` on LP64.
  // If it is necessary, it could be solved with flatbuffers::enable_if<B,T>.
  static_assert(sizeof(T) < sizeof(int64_t), "unexpected type T");
  FLATBUFFERS_ASSERT(s && val);
  int64_t i64;
  // The errno check isn't needed, will return MAX/MIN on overflow.
  if (StringToIntegerImpl(&i64, s, 0, false)) {
    const int64_t max = (flatbuffers::numeric_limits<T>::max)();
    const int64_t min = flatbuffers::numeric_limits<T>::lowest();
    if (i64 > max) {
      *val = static_cast<T>(max);
      return false;
    }
    if (i64 < min) {
      // For unsigned types return max to distinguish from
      // "no conversion can be performed" when 0 is returned.
      *val = static_cast<T>(flatbuffers::is_unsigned<T>::value ? max : min);
      return false;
    }
    *val = static_cast<T>(i64);
    return true;
  }
  *val = 0;
  return false;
}